

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O0

void __thiscall HDualRow::update_flip(HDualRow *this,HVector *bfrtColumn)

{
  undefined8 *in_RDI;
  HModel *unaff_retaddr;
  double change;
  int iCol;
  int i;
  double in_stack_00000058;
  int in_stack_00000064;
  HVector *in_stack_00000068;
  HMatrix *in_stack_00000070;
  int local_14;
  undefined8 *puVar1;
  
  puVar1 = in_RDI;
  HVector::clear((HVector *)unaff_retaddr);
  for (local_14 = 0; local_14 < *(int *)((long)in_RDI + 0xb4); local_14 = local_14 + 1) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (in_RDI + 0x17),(long)local_14);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (in_RDI + 0x17),(long)local_14);
    HModel::flipBound(unaff_retaddr,(int)((ulong)puVar1 >> 0x20));
    HModel::getMatrix((HModel *)*in_RDI);
    HMatrix::collect_aj(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000058);
  }
  return;
}

Assistant:

void HDualRow::update_flip(HVector *bfrtColumn) {
    bfrtColumn->clear();
    for (int i = 0; i < workCount; i++) {
        const int iCol = workData[i].first;
        const double change = workData[i].second;
        workModel->flipBound(iCol);
        workModel->getMatrix()->collect_aj(*bfrtColumn, iCol, change);
    }
}